

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall
MlmWrap::sendMessage
          (MlmWrap *this,char *address,char *subject,TrodesMsg *tmsg,char *tracker,uint32_t timeout)

{
  int iVar1;
  mutex_type *__m;
  zmsg_t *this_00;
  zmsg_t *pzVar2;
  TrodesMsg *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  uint in_R9D;
  lock_guard<std::mutex> lock;
  zmsg_t *zmsg;
  int rc;
  TrodesMsg *in_stack_ffffffffffffff28;
  string local_58 [32];
  zmsg_t *local_38;
  int local_30;
  TrodesMsg *local_20;
  
  local_30 = 0xffffffff;
  local_20 = in_RCX;
  TrodesMsg::getformat_abi_cxx11_(in_stack_ffffffffffffff28);
  __m = (mutex_type *)std::__cxx11::string::c_str();
  this_00 = TrodesMsg::getzmsg(local_20);
  pzVar2 = czhelp_zmsg_create("ssss4sm","MSG",in_RSI,in_RDX,in_R8,(ulong)in_R9D);
  std::__cxx11::string::~string(local_58);
  local_38 = pzVar2;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this_00,__m);
  iVar1 = zactor_send(*(zactor_t **)(in_RDI + 0x40),&local_38);
  local_30 = iVar1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f4c6e);
  return iVar1;
}

Assistant:

int MlmWrap::sendMessage(const char *address, const char *subject, TrodesMsg &tmsg, const char *tracker, uint32_t timeout){
    int rc = -1;
    zmsg_t *zmsg = czhelp_zmsg_create("ssss4sm", mailboxmsg, address, subject, tracker,
                                       timeout, tmsg.getformat().c_str(), tmsg.getzmsg());
    std::lock_guard<std::mutex> lock(actormutex);
    rc = zactor_send(actor, &zmsg);
    return rc;
}